

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self,dtl_dv_t *dv,_Bool indentEnable)

{
  undefined4 uVar1;
  _Bool indentEnable_local;
  dtl_dv_t *dv_local;
  dtl_json_writer_t *self_local;
  
  if ((self == (dtl_json_writer_t *)0x0) || (dv == (dtl_dv_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    uVar1 = dtl_dv_type(dv);
    switch(uVar1) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      dtl_json_writer_write_sv(self,(dtl_sv_t *)dv,indentEnable);
      break;
    case 3:
      dtl_json_writer_write_av(self,(dtl_av_t *)dv,indentEnable);
      break;
    case 4:
      dtl_json_writer_write_hv(self,(dtl_hv_t *)dv,indentEnable);
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self, const dtl_dv_t *dv, bool indentEnable)
{
   if ( (self != 0) && (dv != 0) )
   {
      switch (dtl_dv_type(dv))
      {
      case DTL_DV_INVALID:
         break;
      case DTL_DV_NULL:
         break;
      case DTL_DV_SCALAR:
         dtl_json_writer_write_sv(self, (const dtl_sv_t*) dv, indentEnable);
         break;
      case DTL_DV_ARRAY:
         dtl_json_writer_write_av(self, (const dtl_av_t*) dv, indentEnable);
         break;
      case DTL_DV_HASH:
         dtl_json_writer_write_hv(self, (const dtl_hv_t*) dv, indentEnable);
         break;
      default:
         break;
      }
      return DTL_NO_ERROR;
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}